

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManWindow2(Sbl_Man_t *p,int iPivot)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  Vec_Int_t *vAnds;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Int_t *vRoots;
  timespec local_58;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  Vec_Int_t *local_30;
  
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  iVar2 = Gia_ManComputeOneWin(p->pGia,iPivot,&local_30,&local_38,&local_40,&local_48);
  iVar3 = clock_gettime(3,&local_58);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p->timeWin = p->timeWin + lVar5 + lVar4;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    pVVar1 = p->vRoots;
    pVVar1->nSize = 0;
    if (0 < local_30->nSize) {
      lVar4 = 0;
      do {
        Vec_IntPush(pVVar1,local_30->pArray[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_30->nSize);
    }
    pVVar1 = p->vNodes;
    pVVar1->nSize = 0;
    if (0 < local_38->nSize) {
      lVar4 = 0;
      do {
        Vec_IntPush(pVVar1,local_38->pArray[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_38->nSize);
    }
    pVVar1 = p->vLeaves;
    pVVar1->nSize = 0;
    if (0 < local_40->nSize) {
      lVar4 = 0;
      do {
        Vec_IntPush(pVVar1,local_40->pArray[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_40->nSize);
    }
    pVVar1 = p->vAnds;
    pVVar1->nSize = 0;
    if (0 < local_48->nSize) {
      lVar4 = 0;
      do {
        Vec_IntPush(pVVar1,local_48->pArray[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_48->nSize);
    }
  }
  return iVar2;
}

Assistant:

int Sbl_ManWindow2( Sbl_Man_t * p, int iPivot )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vRoots, * vNodes, * vLeaves, * vAnds;
    int Count = Gia_ManComputeOneWin( p->pGia, iPivot, &vRoots, &vNodes, &vLeaves, &vAnds );
    p->timeWin += Abc_Clock() - clk;
    if ( Count == 0 )
        return 0;
    Vec_IntClear( p->vRoots );   Vec_IntAppend( p->vRoots,  vRoots );
    Vec_IntClear( p->vNodes );   Vec_IntAppend( p->vNodes,  vNodes );
    Vec_IntClear( p->vLeaves );  Vec_IntAppend( p->vLeaves, vLeaves );
    Vec_IntClear( p->vAnds );    Vec_IntAppend( p->vAnds,   vAnds );
//Vec_IntPrint( vRoots );
//Vec_IntPrint( vAnds );
//Vec_IntPrint( vLeaves );
    // recompute internal nodes
//    Gia_ManIncrementTravId( p->pGia );
//    Gia_ManCollectAnds( p->pGia, Vec_IntArray(p->vRoots), Vec_IntSize(p->vRoots), p->vAnds, p->vLeaves );
    return Count;
}